

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::JsRTConstructCallAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint32 uVar1;
  JsRTConstructCallAction *pJVar2;
  TTDVar pvVar3;
  void **ppvVar4;
  FileReader *reader_00;
  FileReader *reader_01;
  FileReader *extraout_RDX;
  Var *local_40;
  uint local_34;
  uint32 i;
  JsRTConstructCallAction *ccAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar3 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_01);
  pJVar2->Result = pvVar3;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  pJVar2->ArgCount = uVar1;
  ppvVar4 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)pJVar2->ArgCount);
  pJVar2->ArgArray = ppvVar4;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  reader_00 = extraout_RDX;
  for (local_34 = 0; local_34 < pJVar2->ArgCount; local_34 = local_34 + 1) {
    reader_00 = (FileReader *)
                NSSnapValues::ParseTTDVar
                          ((NSSnapValues *)(ulong)(local_34 != 0),SUB81(reader,0),reader_00);
    pJVar2->ArgArray[local_34] = reader_00;
  }
  (*reader->_vptr_FileReader[5])();
  if (pJVar2->ArgCount < 2) {
    local_40 = (Var *)0x0;
  }
  else {
    local_40 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)(pJVar2->ArgCount - 1));
  }
  pJVar2->ExecArgs = local_40;
  return;
}

Assistant:

void JsRTConstructCallAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTConstructCallAction* ccAction = GetInlineEventDataAs<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            ccAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            ccAction->ArgCount = reader->ReadLengthValue(true);
            ccAction->ArgArray = alloc.SlabAllocateArray<TTDVar>(ccAction->ArgCount);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < ccAction->ArgCount; ++i)
            {
                ccAction->ArgArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }
            reader->ReadSequenceEnd();

            ccAction->ExecArgs = (ccAction->ArgCount > 1) ? alloc.SlabAllocateArray<Js::Var>(ccAction->ArgCount - 1) : nullptr; //ArgCount includes slot for function which we don't use in exec
        }